

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equals<char32_t,char8_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  char32_t cVar1;
  jessilib *pjVar2;
  jessilib *this;
  char32_t *pcVar3;
  char8_t *pcVar4;
  size_t sVar5;
  decode_result dVar6;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  
  pcVar3 = lhs._M_str;
  sVar5 = lhs._M_len;
  pcVar4 = rhs._M_str;
  pjVar2 = (jessilib *)rhs._M_len;
  for (this = pjVar2; (sVar5 != 0 && (this != (jessilib *)0x0)); this = this + -(long)pjVar2) {
    cVar1 = *pcVar3;
    in_string._M_str = (char8_t *)pjVar2;
    in_string._M_len = (size_t)pcVar4;
    dVar6 = decode_codepoint_utf8<char8_t>(this,in_string);
    pjVar2 = (jessilib *)dVar6.units;
    if (cVar1 != dVar6.codepoint || pjVar2 == (jessilib *)0x0) {
      return false;
    }
    pcVar3 = pcVar3 + 1;
    sVar5 = sVar5 - 1;
    pcVar4 = pcVar4 + (long)pjVar2;
  }
  return sVar5 == 0 && this == (jessilib *)0x0;
}

Assistant:

bool equals(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		return lhs == rhs;
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (lhs_front.codepoint != rhs_front.codepoint) {
			// Codepoints aren't the same
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}